

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::resize_bicubic_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  long in_RCX;
  float *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float *in_R8;
  long in_R9;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  float b3;
  float b2;
  float b1;
  float b0;
  float a3_3;
  float a2_3;
  float a1_3;
  float a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  float a3_2;
  float a2_2;
  float a1_2;
  float a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  float a3_1;
  float a2_1;
  float a1_1;
  float a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  float a3;
  float a2;
  float a1;
  float a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  int iVar15;
  Mat *in_stack_fffffffffffffc70;
  int local_374;
  float *local_370;
  float *local_368;
  float *local_360;
  float *local_358;
  float *local_350;
  int local_304;
  float *local_2e0;
  int local_28c;
  float *local_270;
  int local_214;
  float *local_200;
  int local_1bc;
  float *local_1b0;
  int local_190;
  int local_18c;
  float *local_188;
  float *local_180;
  float *local_178;
  float *local_170;
  Mat local_168;
  Mat local_120;
  Mat local_c8;
  Mat local_80;
  int local_38;
  int local_34;
  long local_30;
  float *local_28;
  long local_20;
  float *local_18;
  Mat *local_10;
  Mat *local_8;
  
  iVar15 = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffc70,iVar15,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  Mat::Mat(in_stack_fffffffffffffc70,iVar15,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  Mat::Mat(in_stack_fffffffffffffc70,iVar15,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  Mat::Mat(in_stack_fffffffffffffc70,iVar15,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_170 = Mat::operator_cast_to_float_(&local_80);
  local_178 = Mat::operator_cast_to_float_(&local_c8);
  local_180 = Mat::operator_cast_to_float_(&local_120);
  local_188 = Mat::operator_cast_to_float_(&local_168);
  local_18c = -3;
  for (local_190 = 0; pfVar14 = local_170, pfVar13 = local_178, pfVar6 = local_180,
      local_190 < local_38; local_190 = local_190 + 1) {
    iVar15 = *(int *)(local_30 + (long)local_190 * 4);
    if (iVar15 != local_18c) {
      if (iVar15 == local_18c + 1) {
        local_170 = local_178;
        local_178 = local_180;
        local_180 = local_188;
        local_188 = pfVar14;
        pfVar6 = Mat::row(local_8,iVar15 + 2);
        local_1b0 = local_18;
        for (local_1bc = 0; local_1bc < local_34; local_1bc = local_1bc + 1) {
          pfVar13 = pfVar6 + *(int *)(local_20 + (long)local_1bc * 4);
          pfVar14[local_1bc] =
               pfVar13[-1] * *local_1b0 + *pfVar13 * local_1b0[1] + pfVar13[1] * local_1b0[2] +
               pfVar13[2] * local_1b0[3];
          local_1b0 = local_1b0 + 4;
        }
      }
      else if (iVar15 == local_18c + 2) {
        local_170 = local_180;
        local_178 = local_188;
        local_180 = pfVar14;
        local_188 = pfVar13;
        pfVar6 = Mat::row(local_8,iVar15 + 1);
        pfVar7 = Mat::row(local_8,iVar15 + 2);
        local_200 = local_18;
        for (local_214 = 0; local_214 < local_34; local_214 = local_214 + 1) {
          iVar5 = *(int *)(local_20 + (long)local_214 * 4);
          pfVar8 = pfVar6 + iVar5;
          pfVar9 = pfVar7 + iVar5;
          fVar1 = *local_200;
          fVar2 = local_200[1];
          fVar3 = local_200[2];
          fVar4 = local_200[3];
          pfVar14[local_214] =
               pfVar8[-1] * fVar1 + *pfVar8 * fVar2 + pfVar8[1] * fVar3 + pfVar8[2] * fVar4;
          pfVar13[local_214] =
               pfVar9[-1] * fVar1 + *pfVar9 * fVar2 + pfVar9[1] * fVar3 + pfVar9[2] * fVar4;
          local_200 = local_200 + 4;
        }
      }
      else if (iVar15 == local_18c + 3) {
        local_170 = local_188;
        local_178 = pfVar14;
        local_180 = pfVar13;
        local_188 = pfVar6;
        pfVar7 = Mat::row(local_8,iVar15);
        pfVar8 = Mat::row(local_8,iVar15 + 1);
        pfVar9 = Mat::row(local_8,iVar15 + 2);
        local_270 = local_18;
        for (local_28c = 0; local_28c < local_34; local_28c = local_28c + 1) {
          iVar5 = *(int *)(local_20 + (long)local_28c * 4);
          pfVar10 = pfVar7 + iVar5;
          pfVar11 = pfVar8 + iVar5;
          pfVar12 = pfVar9 + iVar5;
          fVar1 = *local_270;
          fVar2 = local_270[1];
          fVar3 = local_270[2];
          fVar4 = local_270[3];
          pfVar14[local_28c] =
               pfVar10[-1] * fVar1 + *pfVar10 * fVar2 + pfVar10[1] * fVar3 + pfVar10[2] * fVar4;
          pfVar13[local_28c] =
               pfVar11[-1] * fVar1 + *pfVar11 * fVar2 + pfVar11[1] * fVar3 + pfVar11[2] * fVar4;
          pfVar6[local_28c] =
               pfVar12[-1] * fVar1 + *pfVar12 * fVar2 + pfVar12[1] * fVar3 + pfVar12[2] * fVar4;
          local_270 = local_270 + 4;
        }
      }
      else {
        pfVar6 = Mat::row(local_8,iVar15 + -1);
        pfVar13 = Mat::row(local_8,iVar15);
        pfVar14 = Mat::row(local_8,iVar15 + 1);
        pfVar7 = Mat::row(local_8,iVar15 + 2);
        local_2e0 = local_18;
        for (local_304 = 0; local_304 < local_34; local_304 = local_304 + 1) {
          iVar5 = *(int *)(local_20 + (long)local_304 * 4);
          pfVar8 = pfVar6 + iVar5;
          pfVar9 = pfVar13 + iVar5;
          pfVar10 = pfVar14 + iVar5;
          pfVar11 = pfVar7 + iVar5;
          fVar1 = *local_2e0;
          fVar2 = local_2e0[1];
          fVar3 = local_2e0[2];
          fVar4 = local_2e0[3];
          local_170[local_304] =
               pfVar8[-1] * fVar1 + *pfVar8 * fVar2 + pfVar8[1] * fVar3 + pfVar8[2] * fVar4;
          local_178[local_304] =
               pfVar9[-1] * fVar1 + *pfVar9 * fVar2 + pfVar9[1] * fVar3 + pfVar9[2] * fVar4;
          local_180[local_304] =
               pfVar10[-1] * fVar1 + *pfVar10 * fVar2 + pfVar10[1] * fVar3 + pfVar10[2] * fVar4;
          local_188[local_304] =
               pfVar11[-1] * fVar1 + *pfVar11 * fVar2 + pfVar11[1] * fVar3 + pfVar11[2] * fVar4;
          local_2e0 = local_2e0 + 4;
        }
      }
    }
    fVar1 = *local_28;
    fVar2 = local_28[1];
    fVar3 = local_28[2];
    fVar4 = local_28[3];
    local_350 = local_170;
    local_358 = local_178;
    local_360 = local_180;
    local_368 = local_188;
    local_370 = Mat::row(local_10,local_190);
    for (local_374 = 0; local_374 < local_34; local_374 = local_374 + 1) {
      *local_370 = *local_350 * fVar1 + *local_358 * fVar2 + *local_360 * fVar3 + *local_368 * fVar4
      ;
      local_370 = local_370 + 1;
      local_368 = local_368 + 1;
      local_360 = local_360 + 1;
      local_358 = local_358 + 1;
      local_350 = local_350 + 1;
    }
    local_28 = local_28 + 4;
    local_18c = iVar15;
  }
  Mat::~Mat((Mat *)0x6b82f3);
  Mat::~Mat((Mat *)0x6b8300);
  Mat::~Mat((Mat *)0x6b830d);
  Mat::~Mat((Mat *)0x6b831a);
  return;
}

Assistant:

static void resize_bicubic_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    Mat rowsbuf2(w);
    Mat rowsbuf3(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows0p[dx] = S0p[-1] * a0 + S0p[0] * a1 + S0p[1] * a2 + S0p[2] * a3;
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];
        float b2 = beta[2];
        float b3 = beta[3];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);
        for (int dx = 0; dx < w; dx++)
        {
            //             D[x] = rows0[x]*b0 + rows1[x]*b1 + rows2[x]*b2 + rows3[x]*b3;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1 + *rows2p++ * b2 + *rows3p++ * b3;
        }

        beta += 4;
    }
}